

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int mz_deflateReset(mz_streamp pStream)

{
  tdefl_compressor *d;
  int iVar1;
  
  iVar1 = -2;
  if ((((pStream != (mz_streamp)0x0) &&
       (d = (tdefl_compressor *)pStream->state, d != (tdefl_compressor *)0x0)) &&
      (pStream->zalloc != (mz_alloc_func)0x0)) && (pStream->zfree != (mz_free_func)0x0)) {
    iVar1 = 0;
    pStream->total_out = 0;
    pStream->total_in = 0;
    tdefl_init(d,(tdefl_put_buf_func_ptr)0x0,(void *)0x0,d->m_flags);
  }
  return iVar1;
}

Assistant:

int mz_deflateReset(mz_streamp pStream) {
  if ((!pStream) || (!pStream->state) || (!pStream->zalloc) ||
      (!pStream->zfree))
    return MZ_STREAM_ERROR;
  pStream->total_in = pStream->total_out = 0;
  tdefl_init((tdefl_compressor *)pStream->state, NULL, NULL,
             ((tdefl_compressor *)pStream->state)->m_flags);
  return MZ_OK;
}